

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateFile
          (Generator *this,GeneratorOptions *options,Printer *printer,FileDescriptor *file)

{
  int iVar1;
  Printer *pPVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  uint uVar6;
  FileDescriptor *pFVar7;
  string *psVar8;
  FieldDescriptor *field;
  GeneratorOptions *pGVar9;
  reference ppFVar10;
  FieldDescriptor *file_00;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar11;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  allocator<char> local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  string name_1;
  FileToc *toc;
  _Self local_200;
  _Self local_1f8;
  const_iterator it;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  files;
  FieldDescriptor *local_1c8;
  _Base_ptr local_1c0;
  undefined1 local_1b8;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  int local_12c;
  undefined1 local_128 [4];
  int i_1;
  set<const_google::protobuf::FieldDescriptor_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  extensions;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  provided;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string *local_38;
  string *name;
  GeneratorOptions *pGStack_28;
  int i;
  FileDescriptor *file_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  pGStack_28 = (GeneratorOptions *)file;
  file_local = (FileDescriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  GenerateHeader(this,options,printer);
  if (*(int *)((long)&(printer_local->indent_).field_2 + 0xc) == 1) {
    io::Printer::Print((Printer *)file_local,"var jspb = require(\'google-protobuf\');\n");
    io::Printer::Print((Printer *)file_local,"var goog = jspb;\n");
    io::Printer::Print((Printer *)file_local,"var global = Function(\'return this\')();\n\n");
    for (name._4_4_ = 0; iVar1 = name._4_4_,
        iVar5 = FileDescriptor::dependency_count((FileDescriptor *)pGStack_28), iVar1 < iVar5;
        name._4_4_ = name._4_4_ + 1) {
      pFVar7 = FileDescriptor::dependency((FileDescriptor *)pGStack_28,name._4_4_);
      local_38 = FileDescriptor::name_abi_cxx11_(pFVar7);
      pFVar7 = file_local;
      anon_unknown_0::ModuleAlias(&local_58,local_38);
      psVar8 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)pGStack_28);
      anon_unknown_0::GetRootPath(&local_98,psVar8,local_38);
      anon_unknown_0::GetJSFilename
                ((string *)&provided._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (GeneratorOptions *)printer_local,local_38);
      std::operator+(&local_78,&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &provided._M_t._M_impl.super__Rb_tree_header._M_node_count);
      io::Printer::Print((Printer *)pFVar7,"var $alias$ = require(\'$file$\');\n","alias",&local_58,
                         "file",&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string
                ((string *)&provided._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&extensions._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<const_google::protobuf::FieldDescriptor_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::set((set<const_google::protobuf::FieldDescriptor_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         *)local_128);
  local_12c = 0;
  do {
    iVar1 = local_12c;
    uVar6 = FileDescriptor::extension_count((FileDescriptor *)pGStack_28);
    file_00 = (FieldDescriptor *)(ulong)uVar6;
    if ((int)uVar6 <= iVar1) {
      FindProvidesForFile(this,(GeneratorOptions *)printer_local,(Printer *)file_local,
                          (FileDescriptor *)pGStack_28,
                          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&extensions._M_t._M_impl.super__Rb_tree_header._M_node_count);
      GenerateProvides(this,(GeneratorOptions *)printer_local,(Printer *)file_local,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&extensions._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&it);
      std::
      vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::push_back((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   *)&it,(value_type *)&stack0xffffffffffffffd8);
      if (*(int *)((long)&(printer_local->indent_).field_2 + 0xc) == 0) {
        GenerateRequiresForLibrary
                  (this,(GeneratorOptions *)printer_local,(Printer *)file_local,
                   (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)&it,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&extensions._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      pGVar9 = pGStack_28;
      GenerateClassesAndEnums
                (this,(GeneratorOptions *)printer_local,(Printer *)file_local,
                 (FileDescriptor *)pGStack_28);
      local_1f8._M_node =
           (_Base_ptr)
           std::
           set<const_google::protobuf::FieldDescriptor_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((set<const_google::protobuf::FieldDescriptor_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_128);
      while( true ) {
        local_200._M_node =
             (_Base_ptr)
             std::
             set<const_google::protobuf::FieldDescriptor_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::end((set<const_google::protobuf::FieldDescriptor_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_128);
        bVar3 = std::operator!=(&local_1f8,&local_200);
        pPVar2 = printer_local;
        pFVar7 = file_local;
        if (!bVar3) break;
        ppFVar10 = std::_Rb_tree_const_iterator<const_google::protobuf::FieldDescriptor_*>::
                   operator*(&local_1f8);
        pGVar9 = (GeneratorOptions *)*ppFVar10;
        GenerateExtension(this,(GeneratorOptions *)pPVar2,(Printer *)pFVar7,
                          (FieldDescriptor *)pGVar9);
        std::_Rb_tree_const_iterator<const_google::protobuf::FieldDescriptor_*>::operator++
                  (&local_1f8);
      }
      if (*(int *)((long)&(printer_local->indent_).field_2 + 0xc) == 1) {
        (anonymous_namespace)::GetFilePath_abi_cxx11_
                  ((string *)&toc,(_anonymous_namespace_ *)printer_local,pGStack_28,
                   (FileDescriptor *)pGVar9);
        io::Printer::Print((Printer *)pFVar7,"goog.object.extend(exports, $package$);\n","package",
                           (string *)&toc);
        std::__cxx11::string::~string((string *)&toc);
      }
      for (name_1.field_2._8_8_ = well_known_types_js; *(long *)name_1.field_2._8_8_ != 0;
          name_1.field_2._8_8_ = name_1.field_2._8_8_ + 0x10) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,"google/protobuf/",&local_269);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_248,&local_268,*(char **)name_1.field_2._8_8_);
        std::__cxx11::string::~string((string *)&local_268);
        std::allocator<char>::~allocator(&local_269);
        psVar8 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)pGStack_28);
        anon_unknown_0::StripProto(&local_2b0,psVar8);
        std::operator+(&local_290,&local_2b0,".js");
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_248,&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_2b0);
        if (_Var4) {
          io::Printer::Print((Printer *)file_local,*(char **)(name_1.field_2._8_8_ + 8));
        }
        std::__cxx11::string::~string((string *)local_248);
      }
      std::
      vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)&it);
      std::
      set<const_google::protobuf::FieldDescriptor_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~set((set<const_google::protobuf::FieldDescriptor_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_128);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&extensions._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return;
    }
    if (*(int *)((long)&(printer_local->indent_).field_2 + 0xc) == 0) {
      field = FileDescriptor::extension((FileDescriptor *)pGStack_28,local_12c);
      bVar3 = anon_unknown_0::IgnoreField(field);
      if (!bVar3) goto LAB_0039ffb7;
    }
    else {
LAB_0039ffb7:
      (anonymous_namespace)::GetFilePath_abi_cxx11_
                (&local_190,(_anonymous_namespace_ *)printer_local,pGStack_28,
                 (FileDescriptor *)file_00);
      std::operator+(&local_170,&local_190,".");
      pPVar2 = printer_local;
      pGVar9 = (GeneratorOptions *)FileDescriptor::extension((FileDescriptor *)pGStack_28,local_12c)
      ;
      (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                (&local_1b0,(_anonymous_namespace_ *)pPVar2,pGVar9,file_00);
      std::operator+(&local_150,&local_170,&local_1b0);
      pVar11 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&extensions._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_150);
      local_1c0 = (_Base_ptr)pVar11.first._M_node;
      local_1b8 = pVar11.second;
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      local_1c8 = FileDescriptor::extension((FileDescriptor *)pGStack_28,local_12c);
      std::
      set<const_google::protobuf::FieldDescriptor_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::insert((set<const_google::protobuf::FieldDescriptor_*,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)local_128,&local_1c8);
    }
    local_12c = local_12c + 1;
  } while( true );
}

Assistant:

void Generator::GenerateFile(const GeneratorOptions& options,
                             io::Printer* printer,
                             const FileDescriptor* file) const {
  GenerateHeader(options, printer);

  // Generate "require" statements.
  if (options.import_style == GeneratorOptions::kImportCommonJs) {
    printer->Print("var jspb = require('google-protobuf');\n");
    printer->Print("var goog = jspb;\n");
    printer->Print("var global = Function('return this')();\n\n");

    for (int i = 0; i < file->dependency_count(); i++) {
      const string& name = file->dependency(i)->name();
      printer->Print(
          "var $alias$ = require('$file$');\n",
          "alias", ModuleAlias(name),
          "file", GetRootPath(file->name(), name) + GetJSFilename(options, name));
    }
  }

  std::set<string> provided;
  std::set<const FieldDescriptor*> extensions;
  for (int i = 0; i < file->extension_count(); i++) {
    // We honor the jspb::ignore option here only when working with
    // Closure-style imports. Use of this option is discouraged and so we want
    // to avoid adding new support for it.
    if (options.import_style == GeneratorOptions::kImportClosure &&
        IgnoreField(file->extension(i))) {
      continue;
    }
    provided.insert(GetFilePath(options, file) + "." +
                    JSObjectFieldName(options, file->extension(i)));
    extensions.insert(file->extension(i));
  }

  FindProvidesForFile(options, printer, file, &provided);
  GenerateProvides(options, printer, &provided);
  std::vector<const FileDescriptor*> files;
  files.push_back(file);
  if (options.import_style == GeneratorOptions::kImportClosure) {
    GenerateRequiresForLibrary(options, printer, files, &provided);
  }

  GenerateClassesAndEnums(options, printer, file);

  // Generate code for top-level extensions. Extensions nested inside messages
  // are emitted inside GenerateClassesAndEnums().
  for (std::set<const FieldDescriptor*>::const_iterator it = extensions.begin();
       it != extensions.end(); ++it) {
    GenerateExtension(options, printer, *it);
  }

  if (options.import_style == GeneratorOptions::kImportCommonJs) {
    printer->Print("goog.object.extend(exports, $package$);\n",
                   "package", GetFilePath(options, file));
  }

  // Emit well-known type methods.
  for (FileToc* toc = well_known_types_js; toc->name != NULL; toc++) {
    string name = string("google/protobuf/") + toc->name;
    if (name == StripProto(file->name()) + ".js") {
      printer->Print(toc->data);
    }
  }
}